

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg5s.cc
# Opt level: O3

void __thiscall
trng::mrg5s::seed(mrg5s *this,result_type s1,result_type s2,result_type s3,result_type s4,
                 result_type s5)

{
  int iVar1;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar2 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar6._4_4_ = s2;
  auVar6._0_4_ = s2;
  auVar6._8_4_ = s4;
  auVar6._12_4_ = s4;
  iVar1 = (int)((ulong)(uint)s1 * 0x40002c39 >> 0x20) - (-(uint)(s1 < 0) & 0x40002c39);
  iVar3 = (int)((ulong)(uint)s2 * 0x40002c39 >> 0x20) - (-(uint)(s2 < 0) & 0x40002c39);
  iVar4 = (int)((ulong)(uint)s3 * 0x40002c39 >> 0x20) - (-(uint)(s3 < 0) & 0x40002c39);
  iVar5 = (int)((auVar6._8_8_ & 0xffffffff) * 0x40002c39 >> 0x20) - (-(uint)(s4 < 0) & 0x40002c39);
  auVar2._0_4_ = (iVar1 >> 0x1d) - (iVar1 >> 0x1f);
  auVar2._4_4_ = (iVar3 >> 0x1d) - (iVar3 >> 0x1f);
  auVar2._8_4_ = (iVar4 >> 0x1d) - (iVar4 >> 0x1f);
  auVar2._12_4_ = (iVar5 >> 0x1d) - (iVar5 >> 0x1f);
  auVar7._4_4_ = auVar2._4_4_;
  auVar7._0_4_ = auVar2._4_4_;
  auVar7._8_4_ = auVar2._12_4_;
  auVar7._12_4_ = auVar2._12_4_;
  iVar1 = s1 + auVar2._0_4_ * -0x7fffa78f;
  iVar3 = s2 + auVar2._4_4_ * -0x7fffa78f;
  iVar4 = s3 - (int)((auVar2._8_8_ & 0xffffffff) * 0x7fffa78f);
  iVar5 = s4 - (int)((auVar7._8_8_ & 0xffffffff) * 0x7fffa78f);
  (this->S).r[0] = (-(uint)(iVar1 < 0) & 0x7fffa78f) + iVar1;
  (this->S).r[1] = (-(uint)(iVar3 < 0) & 0x7fffa78f) + iVar3;
  (this->S).r[2] = (-(uint)(iVar4 < 0) & 0x7fffa78f) + iVar4;
  (this->S).r[3] = (-(uint)(iVar5 < 0) & 0x7fffa78f) + iVar5;
  iVar3 = s5 + ((int)((long)s5 * 0x40002c39 >> 0x3d) - (s5 >> 0x1f)) * -0x7fffa78f;
  iVar1 = iVar3 + 0x7fffa78f;
  if (-1 < iVar3) {
    iVar1 = iVar3;
  }
  (this->S).r[4] = iVar1;
  return;
}

Assistant:

void mrg5s::seed(mrg5s::result_type s1, mrg5s::result_type s2, mrg5s::result_type s3,
                   mrg5s::result_type s4, mrg5s::result_type s5) {
    S.r[0] = s1 % modulus;
    if (S.r[0] < 0)
      S.r[0] += modulus;
    S.r[1] = s2 % modulus;
    if (S.r[1] < 0)
      S.r[1] += modulus;
    S.r[2] = s3 % modulus;
    if (S.r[2] < 0)
      S.r[2] += modulus;
    S.r[3] = s4 % modulus;
    if (S.r[3] < 0)
      S.r[3] += modulus;
    S.r[4] = s5 % modulus;
    if (S.r[4] < 0)
      S.r[4] += modulus;
  }